

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937-64.c
# Opt level: O0

void init_by_array64(unsigned_long_long *init_key,unsigned_long_long key_length)

{
  ulong in_RSI;
  long in_RDI;
  unsigned_long_long k;
  unsigned_long_long j;
  unsigned_long_long i;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  init_genrand64(0x12bd6aa);
  local_18 = 1;
  local_20 = 0;
  local_30 = in_RSI;
  if (in_RSI < 0x138) {
    local_30 = 0x138;
  }
  for (local_28 = local_30; local_28 != 0; local_28 = local_28 - 1) {
    mt[local_18] = (mt[local_18] ^
                   (mt[local_18 - 1] ^ mt[local_18 - 1] >> 0x3e) * 0x369dea0f31a53f85) +
                   *(long *)(in_RDI + local_20 * 8) + local_20;
    local_18 = local_18 + 1;
    local_20 = local_20 + 1;
    if (0x137 < local_18) {
      local_18 = 1;
    }
    if (in_RSI <= local_20) {
      local_20 = 0;
    }
  }
  for (local_28 = 0x137; local_28 != 0; local_28 = local_28 + -1) {
    mt[local_18] = (mt[local_18] ^
                   (mt[local_18 - 1] ^ mt[local_18 - 1] >> 0x3e) * 0x27bb2ee687b0b0fd) - local_18;
    local_18 = local_18 + 1;
    if (0x137 < local_18) {
      local_18 = 1;
    }
  }
  mt[0] = 0x8000000000000000;
  return;
}

Assistant:

void init_by_array64(unsigned long long init_key[],
		     unsigned long long key_length)
{
    unsigned long long i, j, k;
    init_genrand64(19650218ULL);
    i=1; j=0;
    k = (NN>key_length ? NN : key_length);
    for (; k; k--) {
        mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 62)) * 3935559000370003845ULL))
          + init_key[j] + j; /* non linear */
        i++; j++;
        if (i>=NN) { mt[0] = mt[NN-1]; i=1; }
        if (j>=key_length) j=0;
    }
    for (k=NN-1; k; k--) {
        mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 62)) * 2862933555777941757ULL))
          - i; /* non linear */
        i++;
        if (i>=NN) { mt[0] = mt[NN-1]; i=1; }
    }

    mt[0] = 1ULL << 63; /* MSB is 1; assuring non-zero initial array */ 
}